

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_> *
__thiscall
vkt::synchronization::anon_unknown_0::CopyBlitImage::Support::build
          (MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
           *__return_storage_ptr__,Support *this,OperationContext *context,Resource *resource)

{
  CopyImplementation *this_00;
  BlitImplementation *this_01;
  DefaultDeleter<vkt::synchronization::Operation> local_36;
  DefaultDeleter<vkt::synchronization::Operation> local_35 [13];
  Resource *local_28;
  Resource *resource_local;
  OperationContext *context_local;
  Support *this_local;
  
  local_28 = resource;
  resource_local = (Resource *)context;
  context_local = (OperationContext *)this;
  this_local = (Support *)__return_storage_ptr__;
  if (this->m_type == TYPE_COPY) {
    this_00 = (CopyImplementation *)operator_new(0x90);
    CopyImplementation::CopyImplementation
              (this_00,(OperationContext *)resource_local,local_28,this->m_mode);
    de::DefaultDeleter<vkt::synchronization::Operation>::DefaultDeleter(local_35);
    de::details::
    MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>::
    MovePtr(__return_storage_ptr__,this_00);
  }
  else {
    this_01 = (BlitImplementation *)operator_new(0x98);
    BlitImplementation::BlitImplementation
              (this_01,(OperationContext *)resource_local,local_28,this->m_mode);
    de::DefaultDeleter<vkt::synchronization::Operation>::DefaultDeleter(&local_36);
    de::details::
    MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>::
    MovePtr(__return_storage_ptr__,this_01);
  }
  return __return_storage_ptr__;
}

Assistant:

de::MovePtr<Operation> build (OperationContext& context, Resource& resource) const
	{
		if (m_type == TYPE_COPY)
			return de::MovePtr<Operation>(new CopyImplementation(context, resource, m_mode));
		else
			return de::MovePtr<Operation>(new BlitImplementation(context, resource, m_mode));
	}